

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

void __thiscall QUrlQuery::setQueryItems(QUrlQuery *this,QList<std::pair<QString,_QString>_> *query)

{
  QUrlQueryPrivate *this_00;
  pair<QString,_QString> *key;
  long lVar1;
  
  clear(this);
  if ((query->d).size != 0) {
    this_00 = QSharedDataPointer::operator_cast_to_QUrlQueryPrivate_((QSharedDataPointer *)this);
    key = (query->d).ptr;
    for (lVar1 = (query->d).size * 0x30; lVar1 != 0; lVar1 = lVar1 + -0x30) {
      QUrlQueryPrivate::addQueryItem(this_00,&key->first,&key->second);
      key = key + 1;
    }
  }
  return;
}

Assistant:

void QUrlQuery::setQueryItems(const QList<std::pair<QString, QString> > &query)
{
    clear();
    if (query.isEmpty())
        return;

    QUrlQueryPrivate *dd = d;
    QList<std::pair<QString, QString> >::const_iterator it = query.constBegin(),
            end = query.constEnd();
    for ( ; it != end; ++it)
        dd->addQueryItem(it->first, it->second);
}